

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::Square(Bignum *this)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint *puVar9;
  int bigit_index1;
  long lVar10;
  long lVar11;
  uint *puVar12;
  bool bVar13;
  
  iVar1 = this->used_digits_;
  lVar5 = (long)iVar1;
  if (0x40 < lVar5) {
    abort();
  }
  if (0 < this->used_digits_) {
    puVar2 = (this->bigits_).start_;
    lVar7 = 0;
    do {
      puVar2[lVar5 + lVar7] = puVar2[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->used_digits_);
  }
  uVar3 = iVar1 * 2;
  uVar4 = (ulong)uVar3;
  iVar8 = this->used_digits_;
  if (iVar8 < 1) {
    uVar6 = 0;
  }
  else {
    puVar12 = (this->bigits_).start_;
    puVar2 = puVar12 + lVar5;
    lVar10 = 0;
    uVar6 = 0;
    puVar9 = puVar2;
    lVar7 = lVar10;
    do {
      do {
        uVar6 = uVar6 + (ulong)*puVar9 * (ulong)puVar2[lVar10];
        bVar13 = lVar10 != 0;
        lVar10 = lVar10 + -1;
        puVar9 = puVar9 + 1;
      } while (bVar13);
      puVar12[lVar7] = (uint)uVar6 & 0xfffffff;
      uVar6 = uVar6 >> 0x1c;
      lVar10 = lVar7 + 1;
      iVar8 = this->used_digits_;
      puVar9 = puVar2;
      lVar7 = lVar10;
    } while (lVar10 < iVar8);
  }
  if (SBORROW4(iVar8,uVar3) != iVar8 + iVar1 * -2 < 0) {
    puVar2 = (this->bigits_).start_;
    lVar7 = (long)iVar8;
    do {
      lVar10 = lVar7 + 1;
      iVar8 = this->used_digits_;
      if (((int)lVar7 - iVar8) + 1 < iVar8) {
        lVar11 = (long)((int)lVar10 - iVar8);
        puVar12 = puVar2 + lVar5 + iVar8;
        do {
          puVar12 = puVar12 + -1;
          uVar6 = uVar6 + (ulong)puVar2[lVar5 + lVar11] * (ulong)*puVar12;
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar8);
      }
      puVar2[lVar7] = (uint)uVar6 & 0xfffffff;
      uVar6 = uVar6 >> 0x1c;
      lVar7 = lVar10;
    } while (lVar10 != (int)uVar3);
  }
  this->used_digits_ = uVar3;
  this->exponent_ = this->exponent_ << 1;
  if (0 < iVar1) {
    puVar2 = (this->bigits_).start_;
    uVar4 = (ulong)uVar3;
    do {
      if (puVar2[uVar4 - 1] != 0) goto LAB_00275f5a;
      this->used_digits_ = (int)uVar4 + -1;
      bVar13 = 1 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar13);
    uVar4 = 0;
  }
LAB_00275f5a:
  if ((int)uVar4 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}